

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr x86_cpu_get_phys_page_attrs_debug_x86_64(CPUState *cs,vaddr addr,MemTxAttrs *attrs)

{
  MemTxAttrs MVar1;
  int32_t iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  int local_b8;
  uint32_t pde_1;
  int32_t sext;
  uint64_t pml4e;
  uint64_t pml4e_addr;
  uint64_t pml5e;
  uint64_t pml5e_addr;
  uint64_t uStack_78;
  _Bool la57;
  uint64_t pdpe;
  uint64_t pde;
  target_ulong pdpe_addr;
  int page_size;
  uint32_t page_offset;
  int32_t a20_mask;
  uint64_t pte;
  target_ulong pte_addr;
  target_ulong pde_addr;
  CPUX86State *env;
  X86CPU *cpu;
  MemTxAttrs *attrs_local;
  vaddr addr_local;
  CPUState *cs_local;
  
  MVar1 = cpu_get_mem_attrs((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb));
  *attrs = MVar1;
  iVar2 = x86_get_a20_mask((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb));
  if (((ulong)cs[1].tb_jmp_cache[0x120] & 0x80000000) == 0) {
    _page_offset = addr & (long)iVar2;
    pdpe_addr._4_4_ = 0x1000;
  }
  else if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
    uVar3 = x86_ldl_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000) +
                                   (addr >> 0x14 & 0xffc) & (long)iVar2);
    if ((uVar3 & 1) == 0) {
      return 0xffffffffffffffff;
    }
    if (((uVar3 & 0x80) == 0) || (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) == 0)) {
      uVar3 = x86_ldl_phys_x86_64(cs,(ulong)(uVar3 & 0xfffff000) + (addr >> 10 & 0xffc) &
                                     (long)iVar2);
      _page_offset = (uint64_t)uVar3;
      if ((uVar3 & 1) == 0) {
        return 0xffffffffffffffff;
      }
      pdpe_addr._4_4_ = 0x1000;
    }
    else {
      _page_offset = (ulong)uVar3 | ((ulong)uVar3 & 0x1fe000) << 0x13;
      pdpe_addr._4_4_ = 0x400000;
    }
    _page_offset = _page_offset & (long)iVar2;
  }
  else {
    if (((ulong)cs[1].tb_jmp_cache[0x101] & 0x4000) == 0) {
      uStack_78 = x86_ldq_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0) +
                                         (addr >> 0x1b & 0x18) & (long)iVar2);
      if ((uStack_78 & 1) == 0) {
        return 0xffffffffffffffff;
      }
    }
    else {
      bVar5 = ((ulong)cs[1].tb_jmp_cache[0x124] & 0x1000) == 0;
      if (bVar5) {
        local_b8 = (int)((long)addr >> 0x2f);
      }
      else {
        local_b8 = (int)(char)(addr >> 0x38);
      }
      if ((local_b8 != 0) && (local_b8 != -1)) {
        return 0xffffffffffffffff;
      }
      if (bVar5) {
        pml4e_addr = (uint64_t)cs[1].tb_jmp_cache[0x123];
      }
      else {
        pml4e_addr = x86_ldq_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000)
                                            + (addr >> 0x30 & 0x1ff) * 8 & (long)iVar2);
        if ((pml4e_addr & 1) == 0) {
          return 0xffffffffffffffff;
        }
      }
      uVar4 = x86_ldq_phys_x86_64(cs,(pml4e_addr & 0xffffffffff000) + (addr >> 0x27 & 0x1ff) * 8 &
                                     (long)iVar2);
      if ((uVar4 & 1) == 0) {
        return 0xffffffffffffffff;
      }
      uStack_78 = x86_ldq_phys_x86_64(cs,(uVar4 & 0xffffffffff000) + (addr >> 0x1e & 0x1ff) * 8 &
                                         (long)iVar2);
      if ((uStack_78 & 1) == 0) {
        return 0xffffffffffffffff;
      }
      if ((uStack_78 & 0x80) != 0) {
        pdpe_addr._4_4_ = 0x40000000;
        _page_offset = uStack_78;
        goto LAB_00533121;
      }
    }
    _page_offset = x86_ldq_phys_x86_64(cs,(uStack_78 & 0xffffffffff000) + (addr >> 0x15 & 0x1ff) * 8
                                          & (long)iVar2);
    if ((_page_offset & 1) == 0) {
      return 0xffffffffffffffff;
    }
    if ((_page_offset & 0x80) == 0) {
      pdpe_addr._4_4_ = 0x1000;
      _page_offset = x86_ldq_phys_x86_64(cs,(_page_offset & 0xffffffffff000) +
                                            (addr >> 0xc & 0x1ff) * 8 & (long)iVar2);
    }
    else {
      pdpe_addr._4_4_ = 0x200000;
    }
    if ((_page_offset & 1) == 0) {
      return 0xffffffffffffffff;
    }
  }
LAB_00533121:
  return (long)(int)(pdpe_addr._4_4_ - 1U ^ 0xffffffff) & 0xffffffffff000U & _page_offset |
         (ulong)((uint)addr & 0xfffff000 & pdpe_addr._4_4_ - 1U);
}

Assistant:

hwaddr x86_cpu_get_phys_page_attrs_debug(CPUState *cs, vaddr addr,
                                         MemTxAttrs *attrs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    target_ulong pde_addr, pte_addr;
    uint64_t pte;
    int32_t a20_mask;
    uint32_t page_offset;
    int page_size;

    *attrs = cpu_get_mem_attrs(env);

    a20_mask = x86_get_a20_mask(env);
    if (!(env->cr[0] & CR0_PG_MASK)) {
        pte = addr & a20_mask;
        page_size = 4096;
    } else if (env->cr[4] & CR4_PAE_MASK) {
        target_ulong pdpe_addr;
        uint64_t pde, pdpe;

#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            bool la57 = env->cr[4] & CR4_LA57_MASK;
            uint64_t pml5e_addr, pml5e;
            uint64_t pml4e_addr, pml4e;
            int32_t sext;

            /* test virtual address sign extension */
            sext = la57 ? (int64_t)addr >> 56 : (int64_t)addr >> 47;
            if (sext != 0 && sext != -1) {
                return -1;
            }

            if (la57) {
                pml5e_addr = ((env->cr[3] & ~0xfff) +
                        (((addr >> 48) & 0x1ff) << 3)) & a20_mask;
                pml5e = x86_ldq_phys(cs, pml5e_addr);
                if (!(pml5e & PG_PRESENT_MASK)) {
                    return -1;
                }
            } else {
                pml5e = env->cr[3];
            }

            pml4e_addr = ((pml5e & PG_ADDRESS_MASK) +
                    (((addr >> 39) & 0x1ff) << 3)) & a20_mask;
            pml4e = x86_ldq_phys(cs, pml4e_addr);
            if (!(pml4e & PG_PRESENT_MASK)) {
                return -1;
            }
            pdpe_addr = ((pml4e & PG_ADDRESS_MASK) +
                         (((addr >> 30) & 0x1ff) << 3)) & a20_mask;
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                return -1;
            }
            if (pdpe & PG_PSE_MASK) {
                page_size = 1024 * 1024 * 1024;
                pte = pdpe;
                goto out;
            }

        } else
#endif
        {
            pdpe_addr = ((env->cr[3] & ~0x1f) + ((addr >> 27) & 0x18)) &
                a20_mask;
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK))
                return -1;
        }

        pde_addr = ((pdpe & PG_ADDRESS_MASK) +
                    (((addr >> 21) & 0x1ff) << 3)) & a20_mask;
        pde = x86_ldq_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            return -1;
        }
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            page_size = 2048 * 1024;
            pte = pde;
        } else {
            /* 4 KB page */
            pte_addr = ((pde & PG_ADDRESS_MASK) +
                        (((addr >> 12) & 0x1ff) << 3)) & a20_mask;
            page_size = 4096;
            pte = x86_ldq_phys(cs, pte_addr);
        }
        if (!(pte & PG_PRESENT_MASK)) {
            return -1;
        }
    } else {
        uint32_t pde;

        /* page directory entry */
        pde_addr = ((env->cr[3] & ~0xfff) + ((addr >> 20) & 0xffc)) & a20_mask;
        pde = x86_ldl_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK))
            return -1;
        if ((pde & PG_PSE_MASK) && (env->cr[4] & CR4_PSE_MASK)) {
            pte = pde | ((pde & 0x1fe000LL) << (32 - 13));
            page_size = 4096 * 1024;
        } else {
            /* page directory entry */
            pte_addr = ((pde & ~0xfff) + ((addr >> 10) & 0xffc)) & a20_mask;
            pte = x86_ldl_phys(cs, pte_addr);
            if (!(pte & PG_PRESENT_MASK)) {
                return -1;
            }
            page_size = 4096;
        }
        pte = pte & a20_mask;
    }

#ifdef TARGET_X86_64
out:
#endif
    pte &= PG_ADDRESS_MASK & ~(page_size - 1);
    page_offset = (addr & TARGET_PAGE_MASK) & (page_size - 1);
    return pte | page_offset;
}